

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O3

int read_VDR(coda_cdf_product *product_file,int64_t offset,int is_zvar)

{
  coda_array_ordering array_ordering;
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [11];
  undefined1 auVar47 [15];
  undefined1 auVar48 [11];
  undefined1 auVar49 [15];
  undefined1 auVar50 [11];
  undefined1 auVar51 [15];
  undefined1 auVar52 [11];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int iVar65;
  int iVar66;
  coda_dynamic_type *field_type;
  int32_t first;
  char *pcVar67;
  int32_t iVar68;
  uint has_compression;
  long lVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  ulong offset_00;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  uint local_208;
  int local_204;
  undefined8 local_200;
  int local_1f8;
  uint local_1f4;
  uint local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  uint local_1e0;
  int local_1dc;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  long local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  coda_cdf_variable *variable;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  undefined1 local_17c [4];
  int32_t dim_varys [8];
  int32_t zdim_sizes [8];
  char name [257];
  int32_t *piVar69;
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  
  if (offset == 0) {
    return 0;
  }
  iVar65 = read_bytes(product_file->raw_product,offset + 8,4,&local_1dc);
  if (iVar65 < 0) {
    return -1;
  }
  auVar71 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  local_1dc >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_1dc >> 0x10),local_1dc
                                                          )) >> 0x20),local_1dc) >> 0x18),
                                      (char)((uint)local_1dc >> 8)),(ushort)(byte)local_1dc) &
                    0xffffff00ffffff);
  auVar71 = pshuflw(auVar71,auVar71,0x1b);
  sVar5 = auVar71._0_2_;
  sVar6 = auVar71._2_2_;
  sVar7 = auVar71._4_2_;
  sVar8 = auVar71._6_2_;
  local_1dc = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar71[6] - (0xff < sVar8),
                       CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar71[4] - (0xff < sVar7),
                                CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar71[2] - (0xff < sVar6)
                                         ,(0 < sVar5) * (sVar5 < 0x100) * auVar71[0] -
                                          (0xff < sVar5))));
  if (is_zvar == 0) {
    if (local_1dc != 3) {
      pcVar67 = "CDF file has invalid record type (%d) for rVDR record";
      goto LAB_00146243;
    }
  }
  else if (local_1dc != 8) {
    pcVar67 = "CDF file has invalid record type (%d) for zVDR record";
LAB_00146243:
    coda_set_error(-300,pcVar67);
    return -1;
  }
  iVar65 = read_bytes(product_file->raw_product,offset + 0xc,8,&local_1a8);
  if (iVar65 < 0) {
    return -1;
  }
  iVar65 = read_bytes(product_file->raw_product,offset + 0x14,4,&local_1e8);
  if (iVar65 < 0) {
    return -1;
  }
  iVar65 = read_bytes(product_file->raw_product,offset + 0x18,4,&local_1ec);
  if (iVar65 < 0) {
    return -1;
  }
  iVar65 = read_bytes(product_file->raw_product,offset + 0x1c,8,&local_1c8);
  if (iVar65 < 0) {
    return -1;
  }
  iVar65 = read_bytes(product_file->raw_product,offset + 0x24,8,&local_1d0);
  if (iVar65 < 0) {
    return -1;
  }
  iVar65 = read_bytes(product_file->raw_product,offset + 0x2c,4,&local_1f0);
  if (iVar65 < 0) {
    return -1;
  }
  iVar65 = read_bytes(product_file->raw_product,offset + 0x30,4,&local_204);
  if (iVar65 < 0) {
    return -1;
  }
  iVar65 = read_bytes(product_file->raw_product,offset + 0x40,4,&local_1f4);
  if (iVar65 < 0) {
    return -1;
  }
  iVar65 = read_bytes(product_file->raw_product,offset + 0x44,4,&local_1f8);
  if (iVar65 < 0) {
    return -1;
  }
  iVar65 = read_bytes(product_file->raw_product,offset + 0x48,8,&local_1d8);
  if (iVar65 < 0) {
    return -1;
  }
  iVar65 = read_bytes(product_file->raw_product,offset + 0x50,4,local_17c);
  if (iVar65 < 0) {
    return -1;
  }
  iVar65 = read_bytes(product_file->raw_product,offset + 0x54,0x100,name);
  if (iVar65 < 0) {
    return -1;
  }
  name[0x100] = '\0';
  rtrim(name);
  auVar13._8_6_ = 0;
  auVar13._0_8_ = local_1a8;
  auVar13[0xe] = (char)(local_1a8 >> 0x38);
  auVar17._8_4_ = 0;
  auVar17._0_8_ = local_1a8;
  auVar17[0xc] = (char)(local_1a8 >> 0x30);
  auVar17._13_2_ = auVar13._13_2_;
  auVar21._8_4_ = 0;
  auVar21._0_8_ = local_1a8;
  auVar21._12_3_ = auVar17._12_3_;
  auVar25._8_2_ = 0;
  auVar25._0_8_ = local_1a8;
  auVar25[10] = (char)(local_1a8 >> 0x28);
  auVar25._11_4_ = auVar21._11_4_;
  auVar29._8_2_ = 0;
  auVar29._0_8_ = local_1a8;
  auVar29._10_5_ = auVar25._10_5_;
  auVar33[8] = (char)(local_1a8 >> 0x20);
  auVar33._0_8_ = local_1a8;
  auVar33._9_6_ = auVar29._9_6_;
  auVar76[7] = 0;
  auVar76._0_7_ = auVar33._8_7_;
  auVar45._7_8_ = 0;
  auVar45._0_7_ = auVar33._8_7_;
  auVar53._1_8_ = SUB158(auVar45 << 0x40,7);
  auVar53[0] = (char)(local_1a8 >> 0x18);
  auVar53._9_6_ = 0;
  auVar46._1_10_ = SUB1510(auVar53 << 0x30,5);
  auVar46[0] = (char)(local_1a8 >> 0x10);
  auVar54._11_4_ = 0;
  auVar54._0_11_ = auVar46;
  auVar37[2] = (char)(local_1a8 >> 8);
  auVar37._0_2_ = (ushort)local_1a8;
  auVar37._3_12_ = SUB1512(auVar54 << 0x20,3);
  auVar41._2_13_ = auVar37._2_13_;
  auVar41._0_2_ = (ushort)local_1a8 & 0xff;
  auVar76._8_4_ = auVar41._0_4_;
  auVar76._12_4_ = auVar46._0_4_;
  auVar71 = pshuflw(auVar76,auVar76,0x1b);
  auVar71 = pshufhw(auVar71,auVar71,0x1b);
  sVar5 = auVar71._0_2_;
  sVar6 = auVar71._2_2_;
  sVar7 = auVar71._4_2_;
  sVar8 = auVar71._6_2_;
  sVar9 = auVar71._8_2_;
  sVar10 = auVar71._10_2_;
  sVar11 = auVar71._12_2_;
  sVar12 = auVar71._14_2_;
  cVar1 = (0 < sVar12) * (sVar12 < 0x100) * auVar71[0xe] - (0xff < sVar12);
  offset_00 = CONCAT17(cVar1,CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar71[0xc] -
                                      (0xff < sVar11),
                                      CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar71[10] -
                                               (0xff < sVar10),
                                               CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar71[8] -
                                                        (0xff < sVar9),
                                                        CONCAT13((0 < sVar8) * (sVar8 < 0x100) *
                                                                 auVar71[6] - (0xff < sVar8),
                                                                 CONCAT12((0 < sVar7) *
                                                                          (sVar7 < 0x100) *
                                                                          auVar71[4] -
                                                                          (0xff < sVar7),
                                                                          CONCAT11((0 < sVar6) *
                                                                                   (sVar6 < 0x100) *
                                                                                   auVar71[2] -
                                                                                   (0xff < sVar6),
                                                                                   (0 < sVar5) *
                                                                                   (sVar5 < 0x100) *
                                                                                   auVar71[0] -
                                                                                   (0xff < sVar5))))
                                                       ))));
  auVar77._8_8_ = 0;
  auVar77._0_8_ =
       (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  local_1e8 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_1e8 >> 0x10),local_1e8
                                                          )) >> 0x20),local_1e8) >> 0x18),
                                       CONCAT12((char)((uint)local_1e8 >> 8),(short)local_1e8)) >>
                             0x10),(short)local_1e8) & 0xffff00ff00ff00ff;
  auVar71 = pshuflw(auVar77,auVar77,0x1b);
  sVar5 = auVar71._0_2_;
  sVar6 = auVar71._2_2_;
  sVar7 = auVar71._4_2_;
  sVar8 = auVar71._6_2_;
  local_1e8 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar71[6] - (0xff < sVar8),
                       CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar71[4] - (0xff < sVar7),
                                CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar71[2] - (0xff < sVar6)
                                         ,(0 < sVar5) * (sVar5 < 0x100) * auVar71[0] -
                                          (0xff < sVar5))));
  auVar78._8_8_ = 0;
  auVar78._0_8_ =
       (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  local_1ec >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_1ec >> 0x10),local_1ec
                                                          )) >> 0x20),local_1ec) >> 0x18),
                                       CONCAT12((char)((uint)local_1ec >> 8),(short)local_1ec)) >>
                             0x10),(short)local_1ec) & 0xffff00ff00ff00ff;
  auVar71 = pshuflw(auVar78,auVar78,0x1b);
  sVar5 = auVar71._0_2_;
  sVar6 = auVar71._2_2_;
  sVar7 = auVar71._4_2_;
  sVar8 = auVar71._6_2_;
  local_1ec = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar71[6] - (0xff < sVar8),
                       CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar71[4] - (0xff < sVar7),
                                CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar71[2] - (0xff < sVar6)
                                         ,(0 < sVar5) * (sVar5 < 0x100) * auVar71[0] -
                                          (0xff < sVar5))));
  auVar14._8_6_ = 0;
  auVar14._0_8_ = local_1c8;
  auVar14[0xe] = (char)(local_1c8 >> 0x38);
  auVar18._8_4_ = 0;
  auVar18._0_8_ = local_1c8;
  auVar18[0xc] = (char)(local_1c8 >> 0x30);
  auVar18._13_2_ = auVar14._13_2_;
  auVar22._8_4_ = 0;
  auVar22._0_8_ = local_1c8;
  auVar22._12_3_ = auVar18._12_3_;
  auVar26._8_2_ = 0;
  auVar26._0_8_ = local_1c8;
  auVar26[10] = (char)(local_1c8 >> 0x28);
  auVar26._11_4_ = auVar22._11_4_;
  auVar30._8_2_ = 0;
  auVar30._0_8_ = local_1c8;
  auVar30._10_5_ = auVar26._10_5_;
  auVar34[8] = (char)(local_1c8 >> 0x20);
  auVar34._0_8_ = local_1c8;
  auVar34._9_6_ = auVar30._9_6_;
  auVar79[7] = 0;
  auVar79._0_7_ = auVar34._8_7_;
  auVar47._7_8_ = 0;
  auVar47._0_7_ = auVar34._8_7_;
  auVar55._1_8_ = SUB158(auVar47 << 0x40,7);
  auVar55[0] = (char)(local_1c8 >> 0x18);
  auVar55._9_6_ = 0;
  auVar48._1_10_ = SUB1510(auVar55 << 0x30,5);
  auVar48[0] = (char)(local_1c8 >> 0x10);
  auVar56._11_4_ = 0;
  auVar56._0_11_ = auVar48;
  auVar38[2] = (char)(local_1c8 >> 8);
  auVar38._0_2_ = (ushort)local_1c8;
  auVar38._3_12_ = SUB1512(auVar56 << 0x20,3);
  auVar42._2_13_ = auVar38._2_13_;
  auVar42._0_2_ = (ushort)local_1c8 & 0xff;
  auVar79._8_4_ = auVar42._0_4_;
  auVar79._12_4_ = auVar48._0_4_;
  auVar71 = pshuflw(auVar79,auVar79,0x1b);
  auVar71 = pshufhw(auVar71,auVar71,0x1b);
  sVar5 = auVar71._0_2_;
  sVar6 = auVar71._2_2_;
  sVar7 = auVar71._4_2_;
  sVar8 = auVar71._6_2_;
  sVar9 = auVar71._8_2_;
  sVar10 = auVar71._10_2_;
  sVar11 = auVar71._12_2_;
  sVar12 = auVar71._14_2_;
  cVar2 = (0 < sVar12) * (sVar12 < 0x100) * auVar71[0xe] - (0xff < sVar12);
  local_1c8 = CONCAT17(cVar2,CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar71[0xc] -
                                      (0xff < sVar11),
                                      CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar71[10] -
                                               (0xff < sVar10),
                                               CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar71[8] -
                                                        (0xff < sVar9),
                                                        CONCAT13((0 < sVar8) * (sVar8 < 0x100) *
                                                                 auVar71[6] - (0xff < sVar8),
                                                                 CONCAT12((0 < sVar7) *
                                                                          (sVar7 < 0x100) *
                                                                          auVar71[4] -
                                                                          (0xff < sVar7),
                                                                          CONCAT11((0 < sVar6) *
                                                                                   (sVar6 < 0x100) *
                                                                                   auVar71[2] -
                                                                                   (0xff < sVar6),
                                                                                   (0 < sVar5) *
                                                                                   (sVar5 < 0x100) *
                                                                                   auVar71[0] -
                                                                                   (0xff < sVar5))))
                                                       ))));
  auVar15._8_6_ = 0;
  auVar15._0_8_ = local_1d0;
  auVar15[0xe] = (char)(local_1d0 >> 0x38);
  auVar19._8_4_ = 0;
  auVar19._0_8_ = local_1d0;
  auVar19[0xc] = (char)(local_1d0 >> 0x30);
  auVar19._13_2_ = auVar15._13_2_;
  auVar23._8_4_ = 0;
  auVar23._0_8_ = local_1d0;
  auVar23._12_3_ = auVar19._12_3_;
  auVar27._8_2_ = 0;
  auVar27._0_8_ = local_1d0;
  auVar27[10] = (char)(local_1d0 >> 0x28);
  auVar27._11_4_ = auVar23._11_4_;
  auVar31._8_2_ = 0;
  auVar31._0_8_ = local_1d0;
  auVar31._10_5_ = auVar27._10_5_;
  auVar35[8] = (char)(local_1d0 >> 0x20);
  auVar35._0_8_ = local_1d0;
  auVar35._9_6_ = auVar31._9_6_;
  auVar80[7] = 0;
  auVar80._0_7_ = auVar35._8_7_;
  auVar49._7_8_ = 0;
  auVar49._0_7_ = auVar35._8_7_;
  auVar57._1_8_ = SUB158(auVar49 << 0x40,7);
  auVar57[0] = (char)(local_1d0 >> 0x18);
  auVar57._9_6_ = 0;
  auVar50._1_10_ = SUB1510(auVar57 << 0x30,5);
  auVar50[0] = (char)(local_1d0 >> 0x10);
  auVar58._11_4_ = 0;
  auVar58._0_11_ = auVar50;
  auVar39[2] = (char)(local_1d0 >> 8);
  auVar39._0_2_ = (ushort)local_1d0;
  auVar39._3_12_ = SUB1512(auVar58 << 0x20,3);
  auVar43._2_13_ = auVar39._2_13_;
  auVar43._0_2_ = (ushort)local_1d0 & 0xff;
  auVar80._8_4_ = auVar43._0_4_;
  auVar80._12_4_ = auVar50._0_4_;
  auVar71 = pshuflw(auVar80,auVar80,0x1b);
  auVar71 = pshufhw(auVar71,auVar71,0x1b);
  sVar5 = auVar71._0_2_;
  sVar6 = auVar71._2_2_;
  sVar7 = auVar71._4_2_;
  sVar8 = auVar71._6_2_;
  sVar9 = auVar71._8_2_;
  sVar10 = auVar71._10_2_;
  sVar11 = auVar71._12_2_;
  sVar12 = auVar71._14_2_;
  cVar3 = (0 < sVar12) * (sVar12 < 0x100) * auVar71[0xe] - (0xff < sVar12);
  local_1d0 = CONCAT17(cVar3,CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar71[0xc] -
                                      (0xff < sVar11),
                                      CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar71[10] -
                                               (0xff < sVar10),
                                               CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar71[8] -
                                                        (0xff < sVar9),
                                                        CONCAT13((0 < sVar8) * (sVar8 < 0x100) *
                                                                 auVar71[6] - (0xff < sVar8),
                                                                 CONCAT12((0 < sVar7) *
                                                                          (sVar7 < 0x100) *
                                                                          auVar71[4] -
                                                                          (0xff < sVar7),
                                                                          CONCAT11((0 < sVar6) *
                                                                                   (sVar6 < 0x100) *
                                                                                   auVar71[2] -
                                                                                   (0xff < sVar6),
                                                                                   (0 < sVar5) *
                                                                                   (sVar5 < 0x100) *
                                                                                   auVar71[0] -
                                                                                   (0xff < sVar5))))
                                                       ))));
  auVar81._8_8_ = 0;
  auVar81._0_8_ =
       (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)(
                                                  local_1f0 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)(local_1f0 >> 0x10),local_1f0)) >>
                                                  0x20),local_1f0) >> 0x18),
                                       CONCAT12((char)(local_1f0 >> 8),(short)local_1f0)) >> 0x10),
                       (short)local_1f0) & 0xffff00ff00ff00ff;
  auVar71 = pshuflw(auVar81,auVar81,0x1b);
  sVar5 = auVar71._0_2_;
  sVar6 = auVar71._2_2_;
  sVar7 = auVar71._4_2_;
  sVar8 = auVar71._6_2_;
  local_1f0 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar71[6] - (0xff < sVar8),
                       CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar71[4] - (0xff < sVar7),
                                CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar71[2] - (0xff < sVar6)
                                         ,(0 < sVar5) * (sVar5 < 0x100) * auVar71[0] -
                                          (0xff < sVar5))));
  auVar82._8_8_ = 0;
  auVar82._0_8_ =
       (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  local_204 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_204 >> 0x10),local_204
                                                          )) >> 0x20),local_204) >> 0x18),
                                       CONCAT12((char)((uint)local_204 >> 8),(short)local_204)) >>
                             0x10),(short)local_204) & 0xffff00ff00ff00ff;
  auVar71 = pshuflw(auVar82,auVar82,0x1b);
  sVar5 = auVar71._0_2_;
  sVar6 = auVar71._2_2_;
  sVar7 = auVar71._4_2_;
  sVar8 = auVar71._6_2_;
  local_204 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar71[6] - (0xff < sVar8),
                       CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar71[4] - (0xff < sVar7),
                                CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar71[2] - (0xff < sVar6)
                                         ,(0 < sVar5) * (sVar5 < 0x100) * auVar71[0] -
                                          (0xff < sVar5))));
  auVar83._8_8_ = 0;
  auVar83._0_8_ =
       (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)(
                                                  local_1f4 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)(local_1f4 >> 0x10),local_1f4)) >>
                                                  0x20),local_1f4) >> 0x18),
                                       CONCAT12((char)(local_1f4 >> 8),(short)local_1f4)) >> 0x10),
                       (short)local_1f4) & 0xffff00ff00ff00ff;
  auVar71 = pshuflw(auVar83,auVar83,0x1b);
  sVar5 = auVar71._0_2_;
  sVar6 = auVar71._2_2_;
  sVar7 = auVar71._4_2_;
  sVar8 = auVar71._6_2_;
  cVar4 = (0 < sVar8) * (sVar8 < 0x100) * auVar71[6] - (0xff < sVar8);
  local_1f4 = CONCAT13(cVar4,CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar71[4] - (0xff < sVar7),
                                      CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar71[2] -
                                               (0xff < sVar6),
                                               (0 < sVar5) * (sVar5 < 0x100) * auVar71[0] -
                                               (0xff < sVar5))));
  auVar84._8_8_ = 0;
  auVar84._0_8_ =
       (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  local_1f8 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_1f8 >> 0x10),local_1f8
                                                          )) >> 0x20),local_1f8) >> 0x18),
                                       CONCAT12((char)((uint)local_1f8 >> 8),(short)local_1f8)) >>
                             0x10),(short)local_1f8) & 0xffff00ff00ff00ff;
  auVar71 = pshuflw(auVar84,auVar84,0x1b);
  sVar5 = auVar71._0_2_;
  sVar6 = auVar71._2_2_;
  sVar7 = auVar71._4_2_;
  sVar8 = auVar71._6_2_;
  local_1f8 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar71[6] - (0xff < sVar8),
                       CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar71[4] - (0xff < sVar7),
                                CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar71[2] - (0xff < sVar6)
                                         ,(0 < sVar5) * (sVar5 < 0x100) * auVar71[0] -
                                          (0xff < sVar5))));
  auVar16._8_6_ = 0;
  auVar16._0_8_ = local_1d8;
  auVar16[0xe] = (char)(local_1d8 >> 0x38);
  auVar20._8_4_ = 0;
  auVar20._0_8_ = local_1d8;
  auVar20[0xc] = (char)(local_1d8 >> 0x30);
  auVar20._13_2_ = auVar16._13_2_;
  auVar24._8_4_ = 0;
  auVar24._0_8_ = local_1d8;
  auVar24._12_3_ = auVar20._12_3_;
  auVar28._8_2_ = 0;
  auVar28._0_8_ = local_1d8;
  auVar28[10] = (char)(local_1d8 >> 0x28);
  auVar28._11_4_ = auVar24._11_4_;
  auVar32._8_2_ = 0;
  auVar32._0_8_ = local_1d8;
  auVar32._10_5_ = auVar28._10_5_;
  auVar36[8] = (char)(local_1d8 >> 0x20);
  auVar36._0_8_ = local_1d8;
  auVar36._9_6_ = auVar32._9_6_;
  auVar71[7] = 0;
  auVar71._0_7_ = auVar36._8_7_;
  auVar51._7_8_ = 0;
  auVar51._0_7_ = auVar36._8_7_;
  auVar59._1_8_ = SUB158(auVar51 << 0x40,7);
  auVar59[0] = (char)(local_1d8 >> 0x18);
  auVar59._9_6_ = 0;
  auVar52._1_10_ = SUB1510(auVar59 << 0x30,5);
  auVar52[0] = (char)(local_1d8 >> 0x10);
  auVar60._11_4_ = 0;
  auVar60._0_11_ = auVar52;
  auVar40[2] = (char)(local_1d8 >> 8);
  auVar40._0_2_ = (ushort)local_1d8;
  auVar40._3_12_ = SUB1512(auVar60 << 0x20,3);
  auVar44._2_13_ = auVar40._2_13_;
  auVar44._0_2_ = (ushort)local_1d8 & 0xff;
  auVar71._8_4_ = auVar44._0_4_;
  auVar71._12_4_ = auVar52._0_4_;
  auVar71 = pshuflw(auVar71,auVar71,0x1b);
  auVar71 = pshufhw(auVar71,auVar71,0x1b);
  sVar5 = auVar71._0_2_;
  sVar6 = auVar71._2_2_;
  sVar7 = auVar71._4_2_;
  sVar8 = auVar71._6_2_;
  sVar9 = auVar71._8_2_;
  sVar10 = auVar71._10_2_;
  sVar11 = auVar71._12_2_;
  sVar12 = auVar71._14_2_;
  local_1d8 = CONCAT17((0 < sVar12) * (sVar12 < 0x100) * auVar71[0xe] - (0xff < sVar12),
                       CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar71[0xc] - (0xff < sVar11),
                                CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar71[10] -
                                         (0xff < sVar10),
                                         CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar71[8] -
                                                  (0xff < sVar9),
                                                  CONCAT13((0 < sVar8) * (sVar8 < 0x100) *
                                                           auVar71[6] - (0xff < sVar8),
                                                           CONCAT12((0 < sVar7) * (sVar7 < 0x100) *
                                                                    auVar71[4] - (0xff < sVar7),
                                                                    CONCAT11((0 < sVar6) *
                                                                             (sVar6 < 0x100) *
                                                                             auVar71[2] -
                                                                             (0xff < sVar6),
                                                                             (0 < sVar5) *
                                                                             (sVar5 < 0x100) *
                                                                             auVar71[0] -
                                                                             (0xff < sVar5))))))));
  local_1a8 = offset_00;
  if ((cVar1 < '\0') || (lVar70 = product_file->file_size, lVar70 <= (long)offset_00)) {
    pcVar67 = "CDF file has invalid offset for VDR record";
  }
  else if ((cVar2 < '\0' || lVar70 <= (long)local_1c8) ||
          (local_188 = local_1c8, cVar3 < '\0' || lVar70 <= (long)local_1d0)) {
    pcVar67 = "CDF file has invalid offset for VXR record";
  }
  else {
    local_1b0 = (ulong)local_1f4;
    if (cVar4 < '\0') {
      pcVar67 = "CDF file has invalid number of elements in VDR record";
    }
    else {
      local_1b8 = (long)local_1f8;
      if (local_1b8 < 0) {
        pcVar67 = "CDF file has invalid variable number in VDR record";
      }
      else {
        local_1c0 = local_1d8;
        if (-2 < (long)local_1d8 && (long)local_1d8 < lVar70) {
          if (local_1e8 == 0x20) {
            pcVar67 = "CDF EPOCH16 data type is not supported";
            iVar65 = -200;
            local_1e4 = 0x20;
            goto LAB_00146278;
          }
          local_1e4 = local_1e8;
          if (is_zvar == 0) {
            local_208 = product_file->rnum_dims;
LAB_00146304:
            if (0 < (int)local_208) {
              local_200 = (int32_t *)(ulong)local_208;
              piVar69 = dim_varys;
              do {
                iVar65 = read_bytes(product_file->raw_product,offset,4,piVar69);
                if (iVar65 < 0) {
                  return -1;
                }
                iVar68 = *piVar69;
                auVar62._1_9_ = SUB169(ZEXT816(0) << 0x40,7);
                auVar62[0] = (char)((uint)iVar68 >> 0x18);
                auVar62._10_6_ = 0;
                auVar73._5_11_ = SUB1611(auVar62 << 0x30,5);
                auVar73[4] = (char)((uint)iVar68 >> 0x10);
                auVar73._0_4_ = iVar68;
                auVar61._12_4_ = 0;
                auVar61._0_12_ = auVar73._4_12_;
                auVar72._3_13_ = SUB1613(auVar61 << 0x20,3);
                auVar72[2] = (char)((uint)iVar68 >> 8);
                auVar72[0] = (byte)iVar68;
                auVar72[1] = 0;
                auVar71 = pshuflw(auVar72,auVar72,0x1b);
                sVar5 = auVar71._0_2_;
                sVar6 = auVar71._2_2_;
                sVar7 = auVar71._4_2_;
                sVar8 = auVar71._6_2_;
                *piVar69 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar71[6] - (0xff < sVar8),
                                    CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar71[4] -
                                             (0xff < sVar7),
                                             CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar71[2] -
                                                      (0xff < sVar6),
                                                      (0 < sVar5) * (sVar5 < 0x100) * auVar71[0] -
                                                      (0xff < sVar5))));
                offset = offset + 4;
                piVar69 = piVar69 + 1;
                local_200 = (int32_t *)((long)local_200 - 1);
              } while (local_200 != (int32_t *)0x0);
              local_200 = (int32_t *)0x0;
            }
          }
          else {
            iVar65 = read_bytes(product_file->raw_product,offset + 0x154,4,&local_1e0);
            if (iVar65 < 0) {
              return -1;
            }
            auVar71 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte
                                                  )(local_1e0 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)(local_1e0 >> 0x10),local_1e0)) >>
                                                  0x20),local_1e0) >> 0x18),(char)(local_1e0 >> 8)),
                                       (ushort)(byte)local_1e0) & 0xffffff00ffffff);
            auVar71 = pshuflw(auVar71,auVar71,0x1b);
            sVar5 = auVar71._0_2_;
            sVar6 = auVar71._2_2_;
            sVar7 = auVar71._4_2_;
            sVar8 = auVar71._6_2_;
            cVar1 = (0 < sVar8) * (sVar8 < 0x100) * auVar71[6] - (0xff < sVar8);
            local_208 = CONCAT13(cVar1,CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar71[4] -
                                                (0xff < sVar7),
                                                CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar71[2]
                                                         - (0xff < sVar6),
                                                         (0 < sVar5) * (sVar5 < 0x100) * auVar71[0]
                                                         - (0xff < sVar5))));
            local_1e0 = local_208;
            if (cVar1 < '\0') {
              pcVar67 = "CDF variable \'%s\' has invalid number of dimensions (%d)";
              goto LAB_00146458;
            }
            if (8 < local_208) {
              pcVar67 = "CDF variable \'%s\' has too many dimensions (%d)";
              goto LAB_00146458;
            }
            if (local_208 != 0) {
              local_198 = (ulong)local_208;
              local_200 = zdim_sizes;
              lVar70 = offset + 0x158;
              local_190 = local_198;
              do {
                iVar65 = read_bytes(product_file->raw_product,lVar70,4,local_200);
                if (iVar65 < 0) {
                  return -1;
                }
                iVar68 = *local_200;
                auVar64._1_9_ = SUB169(ZEXT816(0) << 0x40,7);
                auVar64[0] = (char)((uint)iVar68 >> 0x18);
                auVar64._10_6_ = 0;
                auVar75._5_11_ = SUB1611(auVar64 << 0x30,5);
                auVar75[4] = (char)((uint)iVar68 >> 0x10);
                auVar75._0_4_ = iVar68;
                auVar63._12_4_ = 0;
                auVar63._0_12_ = auVar75._4_12_;
                auVar74._3_13_ = SUB1613(auVar63 << 0x20,3);
                auVar74[2] = (char)((uint)iVar68 >> 8);
                auVar74[0] = (byte)iVar68;
                auVar74[1] = 0;
                auVar71 = pshuflw(auVar74,auVar74,0x1b);
                sVar5 = auVar71._0_2_;
                sVar6 = auVar71._2_2_;
                sVar7 = auVar71._4_2_;
                sVar8 = auVar71._6_2_;
                *local_200 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar71[6] - (0xff < sVar8),
                                      CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar71[4] -
                                               (0xff < sVar7),
                                               CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar71[2] -
                                                        (0xff < sVar6),
                                                        (0 < sVar5) * (sVar5 < 0x100) * auVar71[0] -
                                                        (0xff < sVar5))));
                lVar70 = lVar70 + 4;
                local_200 = local_200 + 1;
                local_190 = local_190 - 1;
              } while (local_190 != 0);
              offset = offset + 0x158 + local_198 * 4;
              local_190 = 0;
              goto LAB_00146304;
            }
            local_208 = 0;
          }
          iVar65 = local_1ec;
          local_200 = (int32_t *)(CONCAT44(local_200._4_4_,local_1f0) & 0xffffffff00000001);
          if (local_1ec == 0 || (local_1f0 & 1) != 0) {
            has_compression = local_1f0 & 4;
            if ((local_1c0 != 0xffffffffffffffff && has_compression != 0) &&
               (iVar66 = read_CPR(product_file,local_1c0), iVar66 != 0)) {
              return -1;
            }
            if (product_file->root_type->num_fields != local_1b8) {
              coda_set_error(-300,"CDF variable has invalid number \'%d\', expected \'%ld\'",
                             local_1b8);
              return -1;
            }
            if (is_zvar == 0) {
              piVar69 = product_file->rdim_sizes;
              array_ordering = product_file->array_ordering;
            }
            else {
              array_ordering = product_file->array_ordering;
              piVar69 = zdim_sizes;
            }
            field_type = coda_cdf_variable_new
                                   (local_1e4,iVar65,(int32_t)local_200,local_208,piVar69,dim_varys,
                                    array_ordering,(int32_t)local_1b0,local_204,has_compression,
                                    &variable);
            iVar68 = (int32_t)piVar69;
            if (field_type == (coda_dynamic_type *)0x0) {
              return -1;
            }
            first = 1;
            iVar65 = coda_mem_record_add_field(product_file->root_type,name,field_type,1);
            if (iVar65 != 0) {
              coda_cdf_type_delete(field_type);
              return -1;
            }
            iVar65 = read_VXR(product_file,variable,local_188,first,iVar68);
            if (iVar65 != 0) {
              return -1;
            }
            iVar65 = read_VDR(product_file,offset_00,is_zvar);
            return -(uint)(iVar65 != 0);
          }
          local_208 = local_1ec + 1;
          pcVar67 = 
          "CDF variable \'%s\' has non-varying record dimension but number of records (%d) is not equal to 1"
          ;
LAB_00146458:
          coda_set_error(-300,pcVar67,name,(ulong)local_208);
          return -1;
        }
        pcVar67 = "CDF file has invalid offset for CPR/SPR record";
      }
    }
  }
  iVar65 = -300;
LAB_00146278:
  coda_set_error(iVar65,pcVar67);
  return -1;
}

Assistant:

static int read_VDR(coda_cdf_product *product_file, int64_t offset, int is_zvar)
{
    coda_dynamic_type *variable_type;
    coda_cdf_variable *variable;
    int32_t record_type;
    int64_t vdr_next;
    int32_t data_type;
    int32_t max_rec;
    int64_t vxr_head;
    int64_t vxr_tail;
    int32_t flags;
    int32_t srecords;
    int32_t num_elems;
    int32_t num;
    int64_t cpr_spr_offset;
    int32_t blocking_factor;
    char name[257];
    int32_t num_dims;
    int32_t zdim_sizes[CODA_MAX_NUM_DIMS];
    int32_t dim_varys[CODA_MAX_NUM_DIMS];
    int record_varys;
    int has_compression;
    int i;

    if (offset == 0)
    {
        return 0;
    }

    if (read_bytes(product_file->raw_product, offset + 8, 4, &record_type) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&record_type);
#endif
    if (is_zvar)
    {
        if (record_type != 8)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid record type (%d) for zVDR record", record_type);
            return -1;
        }
    }
    else
    {
        if (record_type != 3)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid record type (%d) for rVDR record", record_type);
            return -1;
        }
    }

    if (read_bytes(product_file->raw_product, offset + 12, 8, &vdr_next) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 20, 4, &data_type) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 24, 4, &max_rec) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 28, 8, &vxr_head) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 36, 8, &vxr_tail) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 44, 4, &flags) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 48, 4, &srecords) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 64, 4, &num_elems) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 68, 4, &num) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 72, 8, &cpr_spr_offset) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 80, 4, &blocking_factor) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 84, 256, name) < 0)
    {
        return -1;
    }
    name[256] = '\0';
    rtrim(name);
#ifndef WORDS_BIGENDIAN
    swap_int64(&vdr_next);
    swap_int32(&data_type);
    swap_int32(&max_rec);
    swap_int64(&vxr_head);
    swap_int64(&vxr_tail);
    swap_int32(&flags);
    swap_int32(&srecords);
    swap_int32(&num_elems);
    swap_int32(&num);
    swap_int64(&cpr_spr_offset);
    swap_int32(&blocking_factor);
#endif
    if (vdr_next < 0 || vdr_next >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for VDR record");
        return -1;
    }
    if (vxr_head < 0 || vxr_head >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for VXR record");
        return -1;
    }
    if (vxr_tail < 0 || vxr_tail >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for VXR record");
        return -1;
    }
    if (num_elems < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid number of elements in VDR record");
        return -1;
    }
    if (num < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid variable number in VDR record");
        return -1;
    }
    if (cpr_spr_offset < -1 || cpr_spr_offset >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for CPR/SPR record");
        return -1;
    }

    if (data_type == 32)
    {
        coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "CDF EPOCH16 data type is not supported");
        return -1;
    }
    if (is_zvar)
    {
        if (read_bytes(product_file->raw_product, offset + 340, 4, &num_dims) < 0)
        {
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        swap_int32(&num_dims);
#endif
        if (num_dims < 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF variable '%s' has invalid number of dimensions (%d)", name,
                           num_dims);
            return -1;
        }
        if (num_dims > CODA_MAX_NUM_DIMS)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF variable '%s' has too many dimensions (%d)", name, num_dims);
            return -1;
        }
        offset += 344;
        if (num_dims > 0)
        {
            for (i = 0; i < num_dims; i++)
            {
                if (read_bytes(product_file->raw_product, offset + i * 4, 4, &zdim_sizes[i]) < 0)
                {
                    return -1;
                }
#ifndef WORDS_BIGENDIAN
                swap_int32(&zdim_sizes[i]);
#endif
            }
            offset += num_dims * 4;
        }
    }
    else
    {
        num_dims = product_file->rnum_dims;
    }

    if (num_dims > 0)
    {
        for (i = 0; i < num_dims; i++)
        {
            if (read_bytes(product_file->raw_product, offset + i * 4, 4, &dim_varys[i]) < 0)
            {
                return -1;
            }
#ifndef WORDS_BIGENDIAN
            swap_int32(&dim_varys[i]);
#endif
        }
        offset += num_dims * 4;
    }
    record_varys = flags & 1;
    /* int has_pad_value = flags & 2; */
    has_compression = flags & 4;
    /* int64_t pad_value_offset = offset; */
    if (!record_varys && max_rec != 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF variable '%s' has non-varying record dimension but number of records "
                       "(%d) is not equal to 1", name, max_rec + 1);
        return -1;
    }

    if (has_compression && cpr_spr_offset != -1)
    {
        if (read_CPR(product_file, cpr_spr_offset) != 0)
        {
            return -1;
        }
    }
    if (product_file->root_type->num_fields != num)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF variable has invalid number '%d', expected '%ld'", num,
                       product_file->root_type->num_fields);
        return -1;
    }

    if (is_zvar)
    {
        variable_type = coda_cdf_variable_new(data_type, max_rec, record_varys, num_dims, zdim_sizes, dim_varys,
                                              product_file->array_ordering, num_elems, srecords, has_compression,
                                              &variable);
    }
    else
    {
        variable_type = coda_cdf_variable_new(data_type, max_rec, record_varys, num_dims, product_file->rdim_sizes,
                                              dim_varys, product_file->array_ordering, num_elems, srecords,
                                              has_compression, &variable);
    }
    if (variable_type == NULL)
    {
        return -1;
    }
    if (coda_mem_record_add_field(product_file->root_type, name, variable_type, 1) != 0)
    {
        coda_cdf_type_delete((coda_dynamic_type *)variable_type);
        return -1;
    }

    if (read_VXR(product_file, variable, vxr_head, 0, -1) != 0)
    {
        return -1;
    }

    if (read_VDR(product_file, vdr_next, is_zvar) != 0)
    {
        return -1;
    }

    return 0;
}